

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squserdata.h
# Opt level: O1

void __thiscall SQUserData::~SQUserData(SQUserData *this)

{
  ~SQUserData(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~SQUserData()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain, this);
        SetDelegate(NULL);
    }